

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

void p224_select_point(uint64_t idx,size_t size,p224_felem (*pre_comp) [3],p224_felem *out)

{
  size_t i;
  ulong uVar1;
  size_t j;
  long lVar2;
  
  out[2][2] = 0;
  out[2][3] = 0;
  out[2][0] = 0;
  out[2][1] = 0;
  out[1][2] = 0;
  out[1][3] = 0;
  out[1][0] = 0;
  out[1][1] = 0;
  (*out)[2] = 0;
  (*out)[3] = 0;
  (*out)[0] = 0;
  (*out)[1] = 0;
  for (uVar1 = 0; uVar1 != size; uVar1 = uVar1 + 1) {
    for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 1) {
      (*out)[lVar2] =
           (*out)[lVar2] | (*pre_comp)[0][lVar2] & (long)((uVar1 ^ idx) - 1 & ~idx) >> 0x3f;
    }
    pre_comp = pre_comp + 1;
  }
  return;
}

Assistant:

static inline void *OPENSSL_memset(void *dst, int c, size_t n) {
  if (n == 0) {
    return dst;
  }

  return memset(dst, c, n);
}